

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_Expression_x_iutest_x_Arithmetic_Test::Body(iu_Expression_x_iutest_x_Arithmetic_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *in_R9;
  AssertionResult iutest_ar;
  undefined1 local_298 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  AssertionHelper local_270;
  int local_240 [2];
  long *local_238 [2];
  long local_228 [2];
  char local_218;
  ExpressionLHS<int> local_210;
  ExpressionLHS<int> local_1e8;
  int local_1c0 [2];
  undefined1 local_1b8 [32];
  bool local_198;
  ios_base local_138 [264];
  
  local_1e8.m_lhs = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_210,&local_1e8.m_lhs);
  local_240[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_298,&local_210,local_240 + 1);
  local_240[0] = 0x2c;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_270,(ExpressionLHS<int> *)local_298,local_240);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_270,true);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  pcVar2 = local_1b8 + 0x10;
  local_218 = local_198;
  if ((pointer)local_1b8._0_8_ != pcVar2) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  paVar1 = &local_270.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._M_allocated_capacity + 1);
  }
  paVar3 = &local_210.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_218 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_238,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + 2 == 44))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,(char *)local_298._0_8_,(allocator<char> *)&local_210);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x3c;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  local_1e8.m_lhs = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_210,&local_1e8.m_lhs);
  local_240[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator-<int>
            ((ExpressionLHS<int> *)local_298,&local_210,local_240 + 1);
  local_240[0] = 0x28;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_270,(ExpressionLHS<int> *)local_298,local_240);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_270,true);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  local_218 = local_198;
  if ((pointer)local_1b8._0_8_ != pcVar2) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_218 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_238,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() - 2 == 40))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,(char *)local_298._0_8_,(allocator<char> *)&local_210);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x3d;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  local_1e8.m_lhs = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_210,&local_1e8.m_lhs);
  local_240[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator*<int>
            ((ExpressionLHS<int> *)local_298,&local_210,local_240 + 1);
  local_240[0] = 0x54;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_270,(ExpressionLHS<int> *)local_298,local_240);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_270,true);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  local_218 = local_198;
  if ((pointer)local_1b8._0_8_ != pcVar2) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_218 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_238,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() * 2 == 84))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,(char *)local_298._0_8_,(allocator<char> *)&local_210);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x3e;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  local_1e8.m_lhs = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_210,&local_1e8.m_lhs);
  local_240[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator/<int>
            ((ExpressionLHS<int> *)local_298,&local_210,local_240 + 1);
  local_240[0] = 0x15;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_270,(ExpressionLHS<int> *)local_298,local_240);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_270,true);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  local_218 = local_198;
  if ((pointer)local_1b8._0_8_ != pcVar2) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_218 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_238,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() / 2 == 21))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,(char *)local_298._0_8_,(allocator<char> *)&local_210);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x3f;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  local_1e8.m_lhs = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_210,&local_1e8.m_lhs);
  local_240[1] = 4;
  iutest::detail::ExpressionLHS<int>::operator%<int>
            ((ExpressionLHS<int> *)local_298,&local_210,local_240 + 1);
  local_240[0] = 2;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_270,(ExpressionLHS<int> *)local_298,local_240);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_270,true);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  local_218 = local_198;
  if ((pointer)local_1b8._0_8_ != pcVar2) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_218 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_238,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() % 4 == 2))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,(char *)local_298._0_8_,(allocator<char> *)&local_210);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x40;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  local_240[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_1e8,local_240 + 1);
  local_240[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>(&local_210,&local_1e8,local_240);
  local_1c0[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_298,&local_210,local_1c0 + 1);
  local_1c0[0] = 0x7e;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_270,(ExpressionLHS<int> *)local_298,local_1c0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_270,true);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  local_218 = local_198;
  if ((pointer)local_1b8._0_8_ != pcVar2) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_218 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_238,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + f() + f() == 126))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,(char *)local_298._0_8_,(allocator<char> *)&local_210);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x41;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  return;
}

Assistant:

IUTEST(Expression, Arithmetic)
{
    IUTEST_EXPECT(f() + 2 == 44);
    IUTEST_EXPECT(f() - 2 == 40);
    IUTEST_EXPECT(f() * 2 == 84);
    IUTEST_EXPECT(f() / 2 == 21);
    IUTEST_EXPECT(f() % 4 == 2);
    IUTEST_EXPECT(f() + f() + f() == 126);
}